

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

bool __thiscall miniros::Subscription::negotiateConnection(Subscription *this,string *xmlrpc_uri)

{
  TransportHints *this_00;
  pointer pcVar1;
  RPCManager *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pbVar5;
  PollManagerPtr *pPVar6;
  mapped_type *pmVar7;
  string *psVar8;
  XmlRpcValue *pXVar9;
  XmlRpcClient *this_03;
  RPCManagerPtr *pRVar10;
  pointer pbVar11;
  PendingConnectionPtr conn;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  uint32_t peer_port;
  string peer_host;
  XmlRpcValue v;
  long local_e0 [2];
  uint32_t len;
  XmlRpcValue udpros_array;
  shared_ptr<miniros::TransportUDP> local_b8;
  XmlRpcClient *c;
  XmlRpcValue params;
  XmlRpcValue protos_array;
  XmlRpcValue tcpros_array;
  V_string transports;
  
  tcpros_array._type = TypeInvalid;
  tcpros_array._value.asDouble = 0.0;
  protos_array._type = TypeInvalid;
  protos_array._value.asDouble = 0.0;
  params._type = TypeInvalid;
  params._value.asDouble = 0.0;
  udpros_array._type = TypeInvalid;
  udpros_array._value.asDouble = 0.0;
  local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (TransportUDP *)0x0;
  local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->transport_hints_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&transports,&this_00->transports_);
  pbVar5 = transports.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = transports.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (transports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      transports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TransportHints::tcp(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&transports,&this_00->transports_);
    pbVar5 = transports.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar11 = transports.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pbVar11 != pbVar5) {
    iVar4 = 0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)pbVar11);
      if (iVar3 == 0) {
        peer_port = TransportHints::getMaxDatagramSize(this_00);
        pPVar6 = PollManager::instance();
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 (pPVar6->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        std::__shared_ptr<miniros::TransportUDP,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<miniros::TransportUDP>,miniros::PollSet*>
                  ((__shared_ptr<miniros::TransportUDP,(__gnu_cxx::_Lock_policy)2> *)&peer_host,
                   (allocator<miniros::TransportUDP> *)&v,(PollSet **)&conn);
        this_02._M_pi =
             local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peer_host._M_string_length;
        local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)peer_host._M_dataplus;
        peer_host._M_dataplus._M_p = (pointer)0x0;
        peer_host._M_string_length = 0;
        if ((this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi),
           peer_host._M_string_length != 0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peer_host._M_string_length);
        }
        if (peer_port == 0) {
          peer_port = (local_b8.
                       super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->max_datagram_size_;
        }
        TransportUDP::createIncoming
                  (local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,0,false);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&udpros_array,0);
        XmlRpc::XmlRpcValue::operator=(pXVar9,"UDPROS");
        peer_host._M_string_length = peer_host._M_string_length & 0xffffffff00000000;
        peer_host.field_2._M_allocated_capacity = 0;
        peer_host.field_2._8_8_ = &peer_host._M_string_length;
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&conn,"topic","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&peer_host,(key_type *)&conn);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
        md5sum_abi_cxx11_((string *)&conn,this);
        v._0_8_ = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&v,"md5sum","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&peer_host,(key_type *)&v);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((long *)v._0_8_ != local_e0) {
          operator_delete((void *)v._0_8_,local_e0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
        this_node::getName_abi_cxx11_();
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&conn,"callerid","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&peer_host,(key_type *)&conn);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        pcVar1 = (this->datatype_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&conn,pcVar1,pcVar1 + (this->datatype_)._M_string_length);
        v._0_8_ = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&v,"type","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&peer_host,(key_type *)&v);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((long *)v._0_8_ != local_e0) {
          operator_delete((void *)v._0_8_,local_e0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Header::write((int)&peer_host,&conn,(size_t)&len);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  (&v,conn.
                      super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,len);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&udpros_array,1);
        XmlRpc::XmlRpcValue::operator=(pXVar9,&v);
        psVar8 = network::getHost_abi_cxx11_();
        XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&c,psVar8);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&udpros_array,2);
        XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)&c);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&c);
        c = (XmlRpcClient *)
            CONCAT44(c._4_4_,(local_b8.
                              super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->server_port_);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&udpros_array,3);
        XmlRpc::XmlRpcValue::operator=(pXVar9,(int *)&c);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&udpros_array,4);
        XmlRpc::XmlRpcValue::operator=(pXVar9,(int *)&peer_port);
        pXVar9 = XmlRpc::XmlRpcValue::operator[](&protos_array,iVar4);
        XmlRpc::XmlRpcValue::operator=(pXVar9,&udpros_array);
        XmlRpc::XmlRpcValue::invalidate(&v);
        if (conn.
            super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (conn.
                     super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        iVar4 = iVar4 + 1;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&peer_host);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar11);
        if (iVar3 == 0) {
          peer_host._M_dataplus._M_p = (pointer)&peer_host.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&peer_host,"TCPROS","");
          XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&conn,&peer_host);
          pXVar9 = XmlRpc::XmlRpcValue::operator[](&tcpros_array,0);
          XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)&conn);
          XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&conn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)peer_host._M_dataplus._M_p != &peer_host.field_2) {
            operator_delete(peer_host._M_dataplus._M_p,peer_host.field_2._M_allocated_capacity + 1);
          }
          pXVar9 = XmlRpc::XmlRpcValue::operator[](&protos_array,iVar4);
          XmlRpc::XmlRpcValue::operator=(pXVar9,&tcpros_array);
          iVar4 = iVar4 + 1;
        }
        else {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (negotiateConnection::loc.initialized_ == false) {
            peer_host._M_dataplus._M_p = (pointer)&peer_host.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&peer_host,"miniros.subscription","");
            console::initializeLogLocation(&negotiateConnection::loc,&peer_host,Warn);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)peer_host._M_dataplus._M_p != &peer_host.field_2) {
              operator_delete(peer_host._M_dataplus._M_p,peer_host.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (negotiateConnection::loc.level_ != Warn) {
            console::setLogLocationLevel(&negotiateConnection::loc,Warn);
            console::checkLogLocationEnabled(&negotiateConnection::loc);
          }
          if (negotiateConnection::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,negotiateConnection::loc.logger_,
                           negotiateConnection::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x183,
                           "bool miniros::Subscription::negotiateConnection(const std::string &)",
                           "Unsupported transport type hinted: %s, skipping",
                           (pbVar11->_M_dataplus)._M_p);
          }
        }
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar5);
  }
  psVar8 = this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&peer_host,psVar8);
  pXVar9 = XmlRpc::XmlRpcValue::operator[](&params,0);
  XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)&peer_host);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&peer_host);
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&peer_host,&this->name_);
  pXVar9 = XmlRpc::XmlRpcValue::operator[](&params,1);
  XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)&peer_host);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&peer_host);
  pXVar9 = XmlRpc::XmlRpcValue::operator[](&params,2);
  XmlRpc::XmlRpcValue::operator=(pXVar9,&protos_array);
  peer_host._M_string_length = 0;
  peer_host.field_2._M_allocated_capacity =
       peer_host.field_2._M_allocated_capacity & 0xffffffffffffff00;
  peer_host._M_dataplus._M_p = (pointer)&peer_host.field_2;
  bVar2 = network::splitURI(xmlrpc_uri,&peer_host,&peer_port);
  if (bVar2) {
    this_03 = (XmlRpcClient *)operator_new(0xf8);
    XmlRpc::XmlRpcClient::XmlRpcClient(this_03,peer_host._M_dataplus._M_p,peer_port,"/");
    c = this_03;
    bVar2 = XmlRpc::XmlRpcClient::executeNonBlock(this_03,"requestTopic",&params);
    if (bVar2) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ == false) {
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&conn,"miniros.subscription","");
        console::initializeLogLocation
                  (&negotiateConnection(std::__cxx11::string_const&)::loc,(string *)&conn,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Debug) {
        console::setLogLocationLevel(&negotiateConnection(std::__cxx11::string_const&)::loc,Debug);
        console::checkLogLocationEnabled(&negotiateConnection(std::__cxx11::string_const&)::loc);
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       negotiateConnection(std::__cxx11::string_const&)::loc.logger_,
                       negotiateConnection(std::__cxx11::string_const&)::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1a3,"bool miniros::Subscription::negotiateConnection(const std::string &)"
                       ,"Began asynchronous xmlrpc connection to [%s:%d]",peer_host._M_dataplus._M_p
                       ,(ulong)peer_port);
      }
      std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Subscription,void>
                ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&v,
                 (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<miniros::Subscription>);
      std::__shared_ptr<miniros::Subscription::PendingConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::Subscription::PendingConnection>,XmlRpc::XmlRpcClient*&,std::shared_ptr<miniros::TransportUDP>&,std::shared_ptr<miniros::Subscription>,std::__cxx11::string_const&>
                ((__shared_ptr<miniros::Subscription::PendingConnection,(__gnu_cxx::_Lock_policy)2>
                  *)&conn,(allocator<miniros::Subscription::PendingConnection> *)&len,&c,&local_b8,
                 (shared_ptr<miniros::Subscription> *)&v,xmlrpc_uri);
      if (v._value.asTime != (tm *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v._value.asTime);
      }
      pRVar10 = RPCManager::instance();
      this_01 = (pRVar10->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      v._0_8_ = conn.
                super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      v._value = (anon_union_8_8_d5adaace_for__value)
                 conn.
                 super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      if (conn.
          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conn.
           super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conn.
                super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conn.
           super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conn.
                super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      RPCManager::addASyncConnection(this_01,(ASyncXMLRPCConnectionPtr *)&v);
      if (v._value.asTime != (tm *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v._value.asTime);
      }
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->pending_connections_mutex_);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      std::
      _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,std::shared_ptr<miniros::Subscription::PendingConnection>,std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>>,std::less<std::shared_ptr<miniros::Subscription::PendingConnection>>,std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>>>
      ::_M_insert_unique<std::shared_ptr<miniros::Subscription::PendingConnection>const&>
                ((_Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,std::shared_ptr<miniros::Subscription::PendingConnection>,std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>>,std::less<std::shared_ptr<miniros::Subscription::PendingConnection>>,std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>>>
                  *)&this->pending_connections_,&conn);
      pthread_mutex_unlock((pthread_mutex_t *)&this->pending_connections_mutex_);
      if (conn.
          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conn.
                   super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ == false) {
        conn.
        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&conn,"miniros.subscription","");
        console::initializeLogLocation
                  (&negotiateConnection(std::__cxx11::string_const&)::loc,(string *)&conn,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)conn.
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != &local_148) {
          operator_delete(conn.
                          super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_148._M_allocated_capacity + 1);
        }
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Debug) {
        console::setLogLocationLevel(&negotiateConnection(std::__cxx11::string_const&)::loc,Debug);
        console::checkLogLocationEnabled(&negotiateConnection(std::__cxx11::string_const&)::loc);
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       negotiateConnection(std::__cxx11::string_const&)::loc.logger_,
                       negotiateConnection(std::__cxx11::string_const&)::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x199,"bool miniros::Subscription::negotiateConnection(const std::string &)"
                       ,"Failed to contact publisher [%s:%d] for topic [%s]",
                       peer_host._M_dataplus._M_p,(ulong)peer_port,(this->name_)._M_dataplus._M_p);
      }
      if (c != (XmlRpcClient *)0x0) {
        (*(c->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
      }
      if (local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (TransportUDP *)0x0) {
        (*((local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Transport)._vptr_Transport[8])();
      }
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ == false) {
      conn.super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&conn,"miniros.subscription","");
      console::initializeLogLocation
                (&negotiateConnection(std::__cxx11::string_const&)::loc,(string *)&conn,Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)conn.
             super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr != &local_148) {
        operator_delete(conn.
                        super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_148._M_allocated_capacity + 1);
      }
    }
    if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Error) {
      console::setLogLocationLevel(&negotiateConnection(std::__cxx11::string_const&)::loc,Error);
      console::checkLogLocationEnabled(&negotiateConnection(std::__cxx11::string_const&)::loc);
    }
    if (negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ == true) {
      bVar2 = false;
      console::print((FilterBase *)0x0,negotiateConnection(std::__cxx11::string_const&)::loc.logger_
                     ,negotiateConnection(std::__cxx11::string_const&)::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0x18d,"bool miniros::Subscription::negotiateConnection(const std::string &)",
                     "Bad xml-rpc URI: [%s]",(xmlrpc_uri->_M_dataplus)._M_p);
    }
    else {
      bVar2 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)peer_host._M_dataplus._M_p != &peer_host.field_2) {
    operator_delete(peer_host._M_dataplus._M_p,peer_host.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transports);
  if (local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  XmlRpc::XmlRpcValue::invalidate(&udpros_array);
  XmlRpc::XmlRpcValue::invalidate(&params);
  XmlRpc::XmlRpcValue::invalidate(&protos_array);
  XmlRpc::XmlRpcValue::invalidate(&tcpros_array);
  return bVar2;
}

Assistant:

bool Subscription::negotiateConnection(const std::string& xmlrpc_uri)
{
  XmlRpcValue tcpros_array, protos_array, params;
  XmlRpcValue udpros_array;
  TransportUDPPtr udp_transport;
  int protos = 0;
  V_string transports = transport_hints_.getTransports();
  if (transports.empty())
  {
    transport_hints_.reliable();
    transports = transport_hints_.getTransports();
  }
  for (const std::string& transport: transports)
  {
    if (transport == "UDP")
    {
      int max_datagram_size = transport_hints_.getMaxDatagramSize();
      udp_transport = std::make_shared<TransportUDP>(&PollManager::instance()->getPollSet());
      if (!max_datagram_size)
        max_datagram_size = udp_transport->getMaxDatagramSize();
      udp_transport->createIncoming(0, false);
      udpros_array[0] = "UDPROS";
      M_string m;
      m["topic"] = getName();
      m["md5sum"] = md5sum();
      m["callerid"] = this_node::getName();
      m["type"] = datatype();
      std::shared_ptr<uint8_t[]> buffer;
      uint32_t len;
      Header::write(m, buffer, len);
      XmlRpcValue v(buffer.get(), len);
      udpros_array[1] = v;
      udpros_array[2] = network::getHost();
      udpros_array[3] = udp_transport->getServerPort();
      udpros_array[4] = max_datagram_size;

      protos_array[protos++] = udpros_array;
    }
    else if (transport == "TCP")
    {
      tcpros_array[0] = std::string("TCPROS");
      protos_array[protos++] = tcpros_array;
    }
    else
    {
      MINIROS_WARN("Unsupported transport type hinted: %s, skipping", transport.c_str());
    }
  }
  params[0] = this_node::getName();
  params[1] = name_;
  params[2] = protos_array;
  std::string peer_host;
  uint32_t peer_port;
  if (!network::splitURI(xmlrpc_uri, peer_host, peer_port))
  {
    MINIROS_ERROR("Bad xml-rpc URI: [%s]", xmlrpc_uri.c_str());
    return false;
  }

  XmlRpc::XmlRpcClient* c = new XmlRpc::XmlRpcClient(peer_host.c_str(),
                                                     peer_port, "/");
 // if (!c.execute("requestTopic", params, result) || !g_node->validateXmlrpcResponse("requestTopic", result, proto))

  // Initiate the negotiation.  We'll come back and check on it later.
  if (!c->executeNonBlock("requestTopic", params))
  {
    MINIROS_DEBUG("Failed to contact publisher [%s:%d] for topic [%s]",
              peer_host.c_str(), peer_port, name_.c_str());
    delete c;
    if (udp_transport)
    {
      udp_transport->close();
    }

    return false;
  }

  MINIROS_DEBUG("Began asynchronous xmlrpc connection to [%s:%d]", peer_host.c_str(), peer_port);

  // The PendingConnectionPtr takes ownership of c, and will delete it on
  // destruction.
  PendingConnectionPtr conn(std::make_shared<PendingConnection>(c, udp_transport, shared_from_this(), xmlrpc_uri));

  RPCManager::instance()->addASyncConnection(conn);
  // Put this connection on the list that we'll look at later.
  {
    std::scoped_lock<std::mutex> pending_connections_lock(pending_connections_mutex_);
    pending_connections_.insert(conn);
  }

  return true;
}